

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgCoreOneDimensional.cpp
# Opt level: O1

void TasGrid::OneDimensionalNodes::getGaussJacobi
               (int m,vector<double,_std::allocator<double>_> *w,
               vector<double,_std::allocator<double>_> *x,double alpha,double beta)

{
  ulong uVar1;
  uint uVar2;
  ulong uVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  vector<double,_std::allocator<double>_> off_diag;
  vector<double,_std::allocator<double>_> diag;
  allocator_type local_b9;
  double local_b8;
  double local_b0;
  double local_a8;
  double local_a0;
  double local_98;
  vector<double,_std::allocator<double>_> local_90;
  vector<double,_std::allocator<double>_> local_78;
  vector<double,_std::allocator<double>_> *local_60;
  double local_58;
  double local_50;
  double local_48;
  double local_40;
  double local_38;
  
  local_a8 = alpha + beta;
  local_b8 = alpha;
  local_b0 = beta;
  local_a0 = exp2(local_a8 + 1.0);
  local_50 = local_b8 + 1.0;
  local_38 = tgamma(local_50);
  local_58 = local_b0 + 1.0;
  local_40 = tgamma(local_58);
  local_98 = local_a8 + 2.0;
  local_48 = tgamma(local_98);
  ::std::vector<double,_std::allocator<double>_>::vector
            (&local_78,(long)m,(allocator_type *)&local_90);
  uVar2 = m - 1;
  ::std::vector<double,_std::allocator<double>_>::vector(&local_90,(long)(int)uVar2,&local_b9);
  dVar5 = (local_a0 * local_38 * local_40) / local_48;
  *local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
   _M_start = (local_b0 - local_b8) / local_98;
  if (1 < m) {
    dVar7 = (local_50 * 4.0 * local_58) / ((local_a8 + 3.0) * local_98 * local_98);
    local_a0 = dVar5;
    local_60 = w;
    if (dVar7 < 0.0) {
      dVar7 = sqrt(dVar7);
    }
    else {
      dVar7 = SQRT(dVar7);
    }
    *local_90.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
     _M_start = dVar7;
    dVar5 = local_b0;
    dVar7 = local_b8;
    if (m != 2) {
      dVar8 = local_b0 * local_b0 - local_b8 * local_b8;
      uVar3 = 1;
      local_98 = dVar8;
      do {
        uVar1 = uVar3 + 1;
        dVar4 = (double)(int)uVar1;
        dVar6 = dVar4 + dVar4 + local_a8;
        local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start[uVar3] = dVar8 / ((dVar6 + -2.0) * dVar6);
        dVar4 = ((dVar4 + dVar5) * (dVar4 + dVar7) * dVar4 * 4.0 * (local_a8 + dVar4)) /
                ((dVar6 * dVar6 + -1.0) * dVar6 * dVar6);
        if (dVar4 < 0.0) {
          dVar4 = sqrt(dVar4);
          dVar5 = local_b0;
          dVar7 = local_b8;
          dVar8 = local_98;
        }
        else {
          dVar4 = SQRT(dVar4);
        }
        local_90.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start[uVar3] = dVar4;
        uVar3 = uVar1;
      } while (uVar2 != uVar1);
    }
    dVar8 = (double)m + (double)m + local_a8;
    local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start[(int)uVar2] = (dVar5 * dVar5 - dVar7 * dVar7) / ((dVar8 + -2.0) * dVar8);
    w = local_60;
    dVar5 = local_a0;
  }
  TasmanianTridiagonalSolver::decompose(&local_78,&local_90,dVar5,x,w);
  if (local_90.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (double *)0x0) {
    operator_delete(local_90.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_90.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_90.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (double *)0x0) {
    operator_delete(local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void OneDimensionalNodes::getGaussJacobi(int m, std::vector<double> &w, std::vector<double> &x, double alpha, double beta){
    double ab = alpha + beta;
    double mu0 = pow(2.0, 1.0 + ab) * tgamma(alpha + 1.0) * tgamma(beta + 1.0) / tgamma(2.0 + ab);
    std::vector<double> diag(m), off_diag(m-1);
    diag[0] = (beta - alpha) / (2.0 + ab);
    if (m > 1) {
        off_diag[0] =  std::sqrt(4.0 * (1.0 + alpha) * (1.0 + beta) / ((3.0 + ab) * (2.0 + ab) * (2.0 + ab)));
        for(int i=1; i<m-1; i++){
            double di = (double) (i+1);
            diag[i] =  (beta * beta - alpha * alpha) / ((2.0 * di + ab -2.0) * (2.0 * di + ab));
            off_diag[i] = std::sqrt(4.0 * di * (di + alpha) * (di + beta) * (di + ab) /
                                    (((2.0 * di + ab) * (2.0 * di + ab) - 1.0) * (2.0 * di + ab) * (2.0 * di + ab)));
        }
        double dm = (double) m;
        diag[m-1] = (beta * beta - alpha * alpha) / ((2.0 * dm + ab - 2.0) * (2.0 * dm + ab));;
    }
    TasmanianTridiagonalSolver::decompose(diag, off_diag, mu0, x, w);
}